

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsSecondDerivByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          int *categoryWeightsIndices,int *stateFrequenciesIndices,int *cumulativeScaleIndices,
          int *partitionIndices,int partitionCount,double *outSumLogLikelihoodByPartition,
          double *outSumFirstDerivativeByPartition,double *outSumSecondDerivativeByPartition)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float **ppfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  int *piVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  double *pdVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  float *pfVar32;
  uint uVar33;
  float *pfVar34;
  ulong uVar35;
  int iVar36;
  long lVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  double dVar57;
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined8 in_XMM6_Qb;
  int *statesChild;
  
  if (0 < partitionCount) {
    uVar40 = 0;
    do {
      iVar4 = this->gPatternPartitionsStartPatterns[partitionIndices[uVar40]];
      iVar5 = this->gPatternPartitionsStartPatterns[(long)partitionIndices[uVar40] + 1];
      lVar24 = (long)iVar5;
      lVar27 = (long)iVar4;
      iVar25 = iVar5 - iVar4;
      memset(this->integrationTmp + this->kStateCount * iVar4,0,
             (long)(this->kStateCount * iVar25) << 2);
      memset(this->firstDerivTmp + this->kStateCount * iVar4,0,
             (long)(this->kStateCount * iVar25) << 2);
      memset(this->secondDerivTmp + this->kStateCount * iVar4,0,
             (long)(iVar25 * this->kStateCount) << 2);
      iVar25 = childBufferIndices[uVar40];
      iVar6 = cumulativeScaleIndices[uVar40];
      ppfVar10 = this->gTransitionMatrices;
      pfVar11 = ppfVar10[probabilityIndices[uVar40]];
      pfVar12 = ppfVar10[firstDerivativeIndices[uVar40]];
      pfVar13 = ppfVar10[secondDerivativeIndices[uVar40]];
      pfVar14 = this->gCategoryWeights[categoryWeightsIndices[uVar40]];
      pfVar15 = this->gStateFrequencies[stateFrequenciesIndices[uVar40]];
      pfVar16 = this->gPartials[parentBufferIndices[uVar40]];
      if ((iVar25 < this->kTipCount) && (piVar17 = this->gTipStates[iVar25], piVar17 != (int *)0x0))
      {
        iVar25 = this->kCategoryCount;
        uVar39 = this->kStateCount;
        if (0 < (long)iVar25) {
          iVar7 = this->kPartialsPaddedStateCount;
          iVar8 = this->kMatrixSize;
          iVar9 = this->kPatternCount;
          iVar36 = iVar7 * iVar4;
          iVar22 = 0;
          lVar31 = 0;
          do {
            if (iVar4 < iVar5) {
              pfVar32 = this->integrationTmp;
              iVar30 = this->kTransPaddedStateCount;
              lVar37 = (long)iVar36;
              fVar48 = pfVar14[lVar31];
              pfVar18 = this->firstDerivTmp;
              pfVar19 = this->secondDerivTmp;
              pfVar34 = pfVar16 + lVar37;
              lVar28 = lVar27;
              iVar29 = uVar39 * iVar4;
              do {
                if (0 < (int)uVar39) {
                  uVar35 = 0;
                  lVar26 = (long)piVar17[lVar28] + (long)iVar22;
                  do {
                    auVar43 = vfmadd213ss_fma(ZEXT416((uint)(pfVar11[lVar26] * pfVar34[uVar35])),
                                              ZEXT416((uint)fVar48),
                                              ZEXT416((uint)pfVar32[(long)iVar29 + uVar35]));
                    pfVar32[(long)iVar29 + uVar35] = auVar43._0_4_;
                    auVar43 = vfmadd213ss_fma(ZEXT416((uint)(pfVar12[lVar26] * pfVar34[uVar35])),
                                              ZEXT416((uint)fVar48),
                                              ZEXT416((uint)pfVar18[(long)iVar29 + uVar35]));
                    pfVar18[(long)iVar29 + uVar35] = auVar43._0_4_;
                    pfVar20 = pfVar13 + lVar26;
                    lVar26 = lVar26 + iVar30;
                    auVar43 = vfmadd213ss_fma(ZEXT416((uint)(*pfVar20 * pfVar34[uVar35])),
                                              ZEXT416((uint)fVar48),
                                              ZEXT416((uint)pfVar19[(long)iVar29 + uVar35]));
                    pfVar19[(long)iVar29 + uVar35] = auVar43._0_4_;
                    uVar35 = uVar35 + 1;
                  } while (uVar39 != uVar35);
                  iVar29 = iVar29 + (int)uVar35;
                }
                lVar37 = lVar37 + iVar7;
                iVar36 = (int)lVar37;
                pfVar34 = pfVar34 + iVar7;
                lVar28 = lVar28 + 1;
              } while (lVar28 != lVar24);
            }
            iVar36 = iVar36 + ((iVar4 - iVar5) + iVar9) * iVar7;
            lVar31 = lVar31 + 1;
            iVar22 = iVar22 + iVar8;
          } while (lVar31 != iVar25);
        }
      }
      else {
        iVar7 = this->kCategoryCount;
        uVar39 = this->kStateCount;
        if (0 < (long)iVar7) {
          pfVar34 = this->gPartials[iVar25];
          iVar25 = this->kMatrixSize;
          iVar22 = 0;
          lVar31 = 0;
          iVar8 = this->kPartialsPaddedStateCount;
          iVar9 = this->kPatternCount;
          uVar33 = iVar8 * iVar4;
          do {
            uVar35 = (ulong)uVar33;
            if (iVar4 < iVar5) {
              auVar43._0_8_ = (double)pfVar14[lVar31];
              auVar43._8_8_ = in_XMM6_Qb;
              uVar35 = (ulong)(int)uVar33;
              pfVar18 = this->integrationTmp;
              pfVar19 = this->firstDerivTmp;
              pfVar20 = this->secondDerivTmp;
              pfVar32 = pfVar34 + uVar35;
              uVar41 = (ulong)(uVar39 * iVar4);
              iVar36 = iVar4;
              do {
                if (0 < (int)uVar39) {
                  uVar41 = (ulong)(int)uVar41;
                  uVar38 = 0;
                  iVar30 = iVar22;
                  do {
                    dVar49 = 0.0;
                    dVar57 = 0.0;
                    dVar42 = 0.0;
                    uVar23 = 0;
                    do {
                      fVar48 = pfVar32[uVar23];
                      dVar42 = dVar42 + (double)(fVar48 * pfVar11[(long)iVar30 + uVar23]);
                      lVar28 = (long)iVar30 + uVar23;
                      lVar37 = (long)iVar30 + uVar23;
                      uVar23 = uVar23 + 1;
                      dVar57 = dVar57 + (double)(fVar48 * pfVar12[lVar28]);
                      dVar49 = dVar49 + (double)(fVar48 * pfVar13[lVar37]);
                    } while (uVar39 != uVar23);
                    auVar62._0_8_ = (double)pfVar18[uVar41];
                    auVar62._8_8_ = in_XMM6_Qb;
                    iVar30 = iVar30 + uVar39 + 1;
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ = dVar42 * (double)pfVar16[uVar35 + uVar38];
                    auVar50 = vfmadd231sd_fma(auVar62,auVar43,auVar59);
                    pfVar18[uVar41] = (float)auVar50._0_8_;
                    auVar60._0_8_ = (double)pfVar19[uVar41];
                    auVar60._8_8_ = in_XMM6_Qb;
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ = dVar57 * (double)pfVar16[uVar35 + uVar38];
                    auVar50 = vfmadd231sd_fma(auVar60,auVar43,auVar51);
                    pfVar19[uVar41] = (float)auVar50._0_8_;
                    lVar28 = uVar35 + uVar38;
                    auVar61._0_8_ = (double)pfVar20[uVar41];
                    auVar61._8_8_ = in_XMM6_Qb;
                    uVar38 = uVar38 + 1;
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = dVar49 * (double)pfVar16[lVar28];
                    auVar50 = vfmadd231sd_fma(auVar61,auVar43,auVar50);
                    pfVar20[uVar41] = (float)auVar50._0_8_;
                    uVar41 = uVar41 + 1;
                  } while (uVar38 != uVar39);
                }
                uVar35 = uVar35 + (long)iVar8;
                pfVar32 = pfVar32 + iVar8;
                iVar36 = iVar36 + 1;
              } while (iVar36 != iVar5);
            }
            uVar33 = (int)uVar35 + ((iVar4 - iVar5) + iVar9) * iVar8;
            lVar31 = lVar31 + 1;
            iVar22 = iVar22 + iVar25;
          } while (lVar31 != iVar7);
        }
      }
      if (iVar4 < iVar5) {
        iVar25 = uVar39 * iVar4;
        lVar31 = lVar27;
        do {
          iVar7 = this->kStateCount;
          if ((long)iVar7 < 1) {
            auVar43 = ZEXT816(0);
            fVar58 = 0.0;
            fVar48 = 0.0;
          }
          else {
            auVar51 = ZEXT816(0) << 0x40;
            auVar50 = ZEXT816(0) << 0x40;
            auVar43 = ZEXT816(0);
            lVar28 = 0;
            do {
              fVar48 = pfVar15[lVar28];
              auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)fVar48),
                                        ZEXT416((uint)this->integrationTmp[iVar25 + lVar28]));
              auVar50 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar48),
                                        ZEXT416((uint)this->firstDerivTmp[iVar25 + lVar28]));
              auVar51 = vfmadd231ss_fma(auVar51,ZEXT416((uint)fVar48),
                                        ZEXT416((uint)this->secondDerivTmp[iVar25 + lVar28]));
              lVar28 = lVar28 + 1;
            } while (iVar7 != lVar28);
            iVar25 = iVar25 + iVar7;
            fVar48 = auVar51._0_4_;
            fVar58 = auVar50._0_4_;
          }
          fVar56 = auVar43._0_4_;
          dVar42 = log((double)fVar56);
          this->outLogLikelihoodsTmp[lVar31] = (float)dVar42;
          auVar52._0_4_ = fVar48 / fVar56;
          auVar52._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar44._0_4_ = fVar58 / fVar56;
          auVar44._4_12_ = SUB6012((undefined1  [60])0x0,0);
          this->outFirstDerivativesTmp[lVar31] = auVar44._0_4_;
          auVar43 = vfnmadd231ss_fma(auVar52,auVar44,auVar44);
          this->outSecondDerivativesTmp[lVar31] = auVar43._0_4_;
          lVar31 = lVar31 + 1;
        } while (lVar31 != lVar24);
        if (iVar6 != -1) {
          if (iVar5 <= iVar4) goto LAB_0013864e;
          pfVar11 = this->gScaleBuffers[iVar6];
          pfVar12 = this->outLogLikelihoodsTmp;
          lVar31 = lVar27;
          do {
            pfVar12[lVar31] = pfVar11[lVar31] + pfVar12[lVar31];
            lVar31 = lVar31 + 1;
          } while (lVar24 != lVar31);
        }
        outSumLogLikelihoodByPartition[uVar40] = 0.0;
        outSumFirstDerivativeByPartition[uVar40] = 0.0;
        outSumSecondDerivativeByPartition[uVar40] = 0.0;
        if (iVar4 < iVar5) {
          pdVar21 = this->gPatternWeights;
          pfVar11 = this->outLogLikelihoodsTmp;
          pfVar12 = this->outFirstDerivativesTmp;
          pfVar13 = this->outSecondDerivativesTmp;
          do {
            auVar45._0_8_ = (double)pfVar11[lVar27];
            auVar45._8_8_ = in_XMM6_Qb;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = pdVar21[lVar27];
            auVar1._8_8_ = 0;
            auVar1._0_8_ = outSumLogLikelihoodByPartition[uVar40];
            auVar43 = vfmadd213sd_fma(auVar53,auVar45,auVar1);
            outSumLogLikelihoodByPartition[uVar40] = auVar43._0_8_;
            auVar46._0_8_ = (double)pfVar12[lVar27];
            auVar46._8_8_ = in_XMM6_Qb;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = pdVar21[lVar27];
            auVar2._8_8_ = 0;
            auVar2._0_8_ = outSumFirstDerivativeByPartition[uVar40];
            auVar43 = vfmadd213sd_fma(auVar54,auVar46,auVar2);
            outSumFirstDerivativeByPartition[uVar40] = auVar43._0_8_;
            auVar47._0_8_ = (double)pfVar13[lVar27];
            auVar47._8_8_ = in_XMM6_Qb;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = pdVar21[lVar27];
            lVar27 = lVar27 + 1;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = outSumSecondDerivativeByPartition[uVar40];
            auVar43 = vfmadd213sd_fma(auVar55,auVar47,auVar3);
            outSumSecondDerivativeByPartition[uVar40] = auVar43._0_8_;
          } while (lVar24 != lVar27);
        }
      }
      else {
LAB_0013864e:
        outSumLogLikelihoodByPartition[uVar40] = 0.0;
        outSumFirstDerivativeByPartition[uVar40] = 0.0;
        outSumSecondDerivativeByPartition[uVar40] = 0.0;
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 != (uint)partitionCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDerivByPartition(
                                                  const int* parentBufferIndices,
                                                  const int* childBufferIndices,
                                                  const int* probabilityIndices,
                                                  const int* firstDerivativeIndices,
                                                  const int* secondDerivativeIndices,
                                                  const int* categoryWeightsIndices,
                                                  const int* stateFrequenciesIndices,
                                                  const int* cumulativeScaleIndices,
                                                  const int* partitionIndices,
                                                  int partitionCount,
                                                  double* outSumLogLikelihoodByPartition,
                                                  double* outSumFirstDerivativeByPartition,
                                                  double* outSumSecondDerivativeByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&firstDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&secondDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int firstDerivativeIndex = firstDerivativeIndices[p];
        const int secondDerivativeIndex = secondDerivativeIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];
        const int stateFrequenciesIndex = stateFrequenciesIndices[p];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
        const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * kPartialsPaddedStateCount; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }

        } else { // Integrate against a partial at the child

            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = startPattern * kPartialsPaddedStateCount;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount;
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {
                    int w = l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJ = 0.0;
                        double sumOverJD1 = 0.0;
                        double sumOverJD2 = 0.0;
                        for(int j = 0; j < kStateCount; j++) {
                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                            sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                            sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                            w++;
                        }

                        // increment for the extra column at the end
                        w += T_PAD;

                        integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                        u++;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }
        }

        int u = startPattern * kStateCount;
        for(int k = startPattern; k < endPattern; k++) {
            REALTYPE sumOverI = 0.0;
            REALTYPE sumOverID1 = 0.0;
            REALTYPE sumOverID2 = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                sumOverID1 += freqs[i] * firstDerivTmp[u];
                sumOverID2 += freqs[i] * secondDerivTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sumOverI);
            outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
            outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
        }


        if (scalingFactorsIndex != BEAGLE_OP_NONE) {
            const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
            for(int k=startPattern; k < endPattern; k++)
                outLogLikelihoodsTmp[k] += scalingFactors[k];
        }


        outSumLogLikelihoodByPartition[p] = 0.0;
        outSumFirstDerivativeByPartition[p] = 0.0;
        outSumSecondDerivativeByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p]    += outLogLikelihoodsTmp[i]    * gPatternWeights[i];
            outSumFirstDerivativeByPartition[p]  += outFirstDerivativesTmp[i]  * gPatternWeights[i];
            outSumSecondDerivativeByPartition[p] += outSecondDerivativesTmp[i] * gPatternWeights[i];
        }

    }
}